

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMacroCommand.cxx
# Opt level: O2

string * __thiscall
cmMacroHelperCommand::GetName_abi_cxx11_(string *__return_storage_ptr__,cmMacroHelperCommand *this)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)
             (this->Args).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string GetName() const { return this->Args[0]; }